

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getTransferMethodStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TransferMethod method,
          bool isDescription)

{
  char cVar1;
  deBool dVar2;
  ostream *poVar3;
  ulong local_200;
  size_type ndx_10;
  size_type ndx_9;
  size_type ndx_8;
  size_type ndx_7;
  size_type ndx_6;
  size_type ndx_5;
  size_type ndx_4;
  size_type ndx_3;
  size_type ndx_2;
  size_type ndx_1;
  ulong local_1a0;
  size_type ndx;
  locale loc;
  ostringstream desc;
  bool isDescription_local;
  TransferMethod method_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&loc);
  std::locale::locale((locale *)&ndx);
  switch((ulong)this & 0xffffffff) {
  case 0:
    do {
      for (local_1a0 = 0; local_1a0 < 0xb; local_1a0 = local_1a0 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("COPY_BUFFER"[local_1a0] != '_')) {
          cVar1 = std::tolower<char>("COPY_BUFFER"[local_1a0],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 1:
    do {
      for (ndx_2 = 0; ndx_2 < 10; ndx_2 = ndx_2 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("COPY_IMAGE"[ndx_2] != '_')) {
          cVar1 = std::tolower<char>("COPY_IMAGE"[ndx_2],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 2:
    do {
      for (ndx_3 = 0; ndx_3 < 10; ndx_3 = ndx_3 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("BLIT_IMAGE"[ndx_3] != '_')) {
          cVar1 = std::tolower<char>("BLIT_IMAGE"[ndx_3],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 3:
    do {
      for (ndx_4 = 0; ndx_4 < 0x14; ndx_4 = ndx_4 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("COPY_BUFFER_TO_IMAGE"[ndx_4] != '_')) {
          cVar1 = std::tolower<char>("COPY_BUFFER_TO_IMAGE"[ndx_4],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 4:
    do {
      for (ndx_5 = 0; ndx_5 < 0x14; ndx_5 = ndx_5 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("COPY_IMAGE_TO_BUFFER"[ndx_5] != '_')) {
          cVar1 = std::tolower<char>("COPY_IMAGE_TO_BUFFER"[ndx_5],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 5:
    do {
      for (ndx_6 = 0; ndx_6 < 0xd; ndx_6 = ndx_6 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("UPDATE_BUFFER"[ndx_6] != '_')) {
          cVar1 = std::tolower<char>("UPDATE_BUFFER"[ndx_6],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 6:
    do {
      for (ndx_7 = 0; ndx_7 < 0xb; ndx_7 = ndx_7 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("FILL_BUFFER"[ndx_7] != '_')) {
          cVar1 = std::tolower<char>("FILL_BUFFER"[ndx_7],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 7:
    do {
      for (ndx_8 = 0; ndx_8 < 0x11; ndx_8 = ndx_8 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("CLEAR_COLOR_IMAGE"[ndx_8] != '_')) {
          cVar1 = std::tolower<char>("CLEAR_COLOR_IMAGE"[ndx_8],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 8:
    do {
      for (ndx_9 = 0; ndx_9 < 0x19; ndx_9 = ndx_9 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("CLEAR_DEPTH_STENCIL_IMAGE"[ndx_9] != '_')) {
          cVar1 = std::tolower<char>("CLEAR_DEPTH_STENCIL_IMAGE"[ndx_9],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 9:
    do {
      for (ndx_10 = 0; ndx_10 < 0xd; ndx_10 = ndx_10 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("RESOLVE_IMAGE"[ndx_10] != '_')) {
          cVar1 = std::tolower<char>("RESOLVE_IMAGE"[ndx_10],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  case 10:
    do {
      for (local_200 = 0; local_200 < 0x17; local_200 = local_200 + 1) {
        if (((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) ||
           ("COPY_QUERY_POOL_RESULTS"[local_200] != '_')) {
          cVar1 = std::tolower<char>("COPY_QUERY_POOL_RESULTS"[local_200],(locale *)&ndx);
          std::operator<<((ostream *)&loc,cVar1);
        }
        else {
          std::operator<<((ostream *)&loc," ");
        }
      }
      if ((method & TRANSFER_METHOD_COPY_IMAGE) == TRANSFER_METHOD_COPY_BUFFER) {
        poVar3 = std::operator<<((ostream *)&loc,"_");
        std::operator<<(poVar3,"method");
      }
      else {
        poVar3 = std::operator<<((ostream *)&loc," ");
        std::operator<<(poVar3,"method");
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    break;
  default:
    std::operator<<((ostream *)&loc,"unknown method!");
  }
  std::__cxx11::ostringstream::str();
  std::locale::~locale((locale *)&ndx);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&loc);
  return __return_storage_ptr__;
}

Assistant:

std::string getTransferMethodStr(const TransferMethod method,
								 bool                 isDescription)
{
	std::ostringstream desc;
	std::locale loc;
	switch(method)
	{
#define METHOD_CASE(p)                             \
		case TRANSFER_METHOD_##p:                  \
		{                                          \
			GEN_DESC_STRING(p, method);            \
			break;                                 \
		}
	  METHOD_CASE(COPY_BUFFER)
	  METHOD_CASE(COPY_IMAGE)
	  METHOD_CASE(BLIT_IMAGE)
	  METHOD_CASE(COPY_BUFFER_TO_IMAGE)
	  METHOD_CASE(COPY_IMAGE_TO_BUFFER)
	  METHOD_CASE(UPDATE_BUFFER)
	  METHOD_CASE(FILL_BUFFER)
	  METHOD_CASE(CLEAR_COLOR_IMAGE)
	  METHOD_CASE(CLEAR_DEPTH_STENCIL_IMAGE)
	  METHOD_CASE(RESOLVE_IMAGE)
	  METHOD_CASE(COPY_QUERY_POOL_RESULTS)
#undef METHOD_CASE
	  default:
		desc << "unknown method!";
		DE_FATAL("Unknown method!");
		break;
	};

	return desc.str();
}